

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocumentUtil.h
# Opt level: O0

Cluster * Assimp::FBX::Util::ProcessSimpleConnection<Assimp::FBX::Cluster>
                    (Connection *con,bool is_object_property_conn,char *name,Element *element,
                    char **propNameOut)

{
  Element *pEVar1;
  long lVar2;
  char *pcVar3;
  Connection *local_1c8;
  allocator<char> local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  Object *local_120;
  Object *ob;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  char **local_38;
  char **propNameOut_local;
  Element *element_local;
  char *name_local;
  Connection *pCStack_18;
  bool is_object_property_conn_local;
  Connection *con_local;
  
  local_38 = propNameOut;
  propNameOut_local = (char **)element;
  element_local = (Element *)name;
  name_local._7_1_ = is_object_property_conn;
  pCStack_18 = con;
  if (is_object_property_conn) {
    Connection::PropertyName_abi_cxx11_(con);
    lVar2 = std::__cxx11::string::length();
    pEVar1 = element_local;
    if (lVar2 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,(char *)pEVar1,&local_99);
      std::operator+(&local_78,"expected incoming ",&local_98);
      std::operator+(&local_58,&local_78," link to be an object-object connection, ignoring");
      DOMWarning(&local_58,(Element *)propNameOut_local);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
      return (Cluster *)0x0;
    }
  }
  if ((name_local._7_1_ & 1) == 0) {
    Connection::PropertyName_abi_cxx11_(pCStack_18);
    lVar2 = std::__cxx11::string::length();
    pEVar1 = element_local;
    if (lVar2 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,(char *)pEVar1,(allocator<char> *)((long)&ob + 7));
      std::operator+(&local_f0,"expected incoming ",&local_110);
      std::operator+(&local_d0,&local_f0," link to be an object-property connection, ignoring");
      DOMWarning(&local_d0,(Element *)propNameOut_local);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator((allocator<char> *)((long)&ob + 7));
      return (Cluster *)0x0;
    }
  }
  if (((name_local._7_1_ & 1) != 0) && (local_38 != (char **)0x0)) {
    Connection::PropertyName_abi_cxx11_(pCStack_18);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    *local_38 = pcVar3;
  }
  local_120 = Connection::SourceObject(pCStack_18);
  pEVar1 = element_local;
  if (local_120 == (Object *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_180,(char *)pEVar1,&local_181);
    std::operator+(&local_160,"failed to read source object for incoming ",&local_180);
    std::operator+(&local_140,&local_160," link, ignoring");
    DOMWarning(&local_140,(Element *)propNameOut_local);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator(&local_181);
    con_local = (Connection *)0x0;
  }
  else {
    if (local_120 == (Object *)0x0) {
      local_1c8 = (Connection *)0x0;
    }
    else {
      local_1c8 = (Connection *)
                  __dynamic_cast(local_120,&FBX::Object::typeinfo,&Cluster::typeinfo,0);
    }
    con_local = local_1c8;
  }
  return (Cluster *)con_local;
}

Assistant:

inline
const T* ProcessSimpleConnection(const Connection& con,
    bool is_object_property_conn,
    const char* name,
    const Element& element,
    const char** propNameOut = nullptr)
{
    if (is_object_property_conn && !con.PropertyName().length()) {
        DOMWarning("expected incoming " + std::string(name) +
            " link to be an object-object connection, ignoring",
            &element
            );
        return nullptr;
    }
    else if (!is_object_property_conn && con.PropertyName().length()) {
        DOMWarning("expected incoming " + std::string(name) +
            " link to be an object-property connection, ignoring",
            &element
            );
        return nullptr;
    }

    if(is_object_property_conn && propNameOut) {
        // note: this is ok, the return value of PropertyValue() is guaranteed to
        // remain valid and unchanged as long as the document exists.
        *propNameOut = con.PropertyName().c_str();
    }

    const Object* const ob = con.SourceObject();
    if(!ob) {
        DOMWarning("failed to read source object for incoming " + std::string(name) +
            " link, ignoring",
            &element);
        return nullptr;
    }

    return dynamic_cast<const T*>(ob);
}